

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

MESSAGE_HANDLE message_clone(MESSAGE_HANDLE source_message)

{
  BODY_AMQP_DATA *pBVar1;
  size_t __size;
  MESSAGE_HANDLE message;
  HEADER_HANDLE pHVar2;
  AMQP_VALUE pAVar3;
  PROPERTIES_HANDLE pPVar4;
  LOGGER_LOG p_Var5;
  BODY_AMQP_DATA *pBVar6;
  void *__dest;
  AMQP_VALUE *ppAVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (source_message == (MESSAGE_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (MESSAGE_HANDLE)0x0;
    }
    pcVar10 = "NULL source_message";
    iVar8 = 0x8c;
LAB_00126d78:
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
              ,"message_clone",iVar8,1,pcVar10);
    return (MESSAGE_HANDLE)0x0;
  }
  message = message_create();
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (MESSAGE_HANDLE)0x0;
    }
    pcVar10 = "Cannot clone message";
    iVar8 = 0x96;
    goto LAB_00126d78;
  }
  message->message_format = source_message->message_format;
  if (source_message->header == (HEADER_HANDLE)0x0) {
LAB_00126c45:
    if (source_message->delivery_annotations != (AMQP_VALUE)0x0) {
      pAVar3 = amqpvalue_clone(source_message->delivery_annotations);
      message->delivery_annotations = pAVar3;
      if (pAVar3 == (AMQP_VALUE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Cannot clone delivery annotations";
        iVar8 = 0xb0;
        goto LAB_001270f3;
      }
    }
    if (source_message->message_annotations != (AMQP_VALUE)0x0) {
      pAVar3 = amqpvalue_clone(source_message->message_annotations);
      message->message_annotations = pAVar3;
      if (pAVar3 == (AMQP_VALUE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Cannot clone message annotations";
        iVar8 = 0xbd;
        goto LAB_001270f3;
      }
    }
    if (source_message->properties != (PROPERTIES_HANDLE)0x0) {
      pPVar4 = properties_clone(source_message->properties);
      message->properties = pPVar4;
      if (pPVar4 == (PROPERTIES_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Cannot clone message properties";
        iVar8 = 0xca;
        goto LAB_001270f3;
      }
    }
    if (source_message->application_properties != (AMQP_VALUE)0x0) {
      pAVar3 = amqpvalue_clone(source_message->application_properties);
      message->application_properties = pAVar3;
      if (pAVar3 == (AMQP_VALUE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Cannot clone application annotations";
        iVar8 = 0xd7;
        goto LAB_001270f3;
      }
    }
    if (source_message->footer != (AMQP_VALUE)0x0) {
      pAVar3 = amqpvalue_clone(source_message->footer);
      message->footer = pAVar3;
      if (pAVar3 == (AMQP_VALUE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Cannot clone message footer";
        iVar8 = 0xe4;
        goto LAB_001270f3;
      }
    }
    uVar12 = source_message->body_amqp_data_count;
    if (uVar12 == 0) {
LAB_00126fb2:
      uVar12 = source_message->body_amqp_sequence_count;
      if (uVar12 == 0) {
LAB_001270b3:
        if (source_message->body_amqp_value == (AMQP_VALUE)0x0) {
          return message;
        }
        pAVar3 = amqpvalue_clone(source_message->body_amqp_value);
        message->body_amqp_value = pAVar3;
        if (pAVar3 != (AMQP_VALUE)0x0) {
          return message;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Cannot clone body AMQP value";
        iVar8 = 0x154;
      }
      else if (uVar12 >> 0x3d == 0) {
        ppAVar7 = (AMQP_VALUE *)calloc(1,uVar12 << 3);
        message->body_amqp_sequence_items = ppAVar7;
        if (ppAVar7 != (AMQP_VALUE *)0x0) {
          uVar12 = 0;
          do {
            pAVar3 = amqpvalue_clone(source_message->body_amqp_sequence_items[uVar12]);
            message->body_amqp_sequence_items[uVar12] = pAVar3;
            if (message->body_amqp_sequence_items[uVar12] == (AMQP_VALUE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                          ,"message_clone",0x13d,1,"Cannot clone AMQP sequence %u",(int)uVar12);
              }
              break;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < source_message->body_amqp_sequence_count);
          message->body_amqp_sequence_count = uVar12;
          if (uVar12 < source_message->body_amqp_sequence_count) goto LAB_001270fe;
          goto LAB_001270b3;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Cannot allocate memory for body AMQP sequences";
        iVar8 = 0x12f;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
        pcVar10 = "Invalid size for body_amqp_sequence_items";
        iVar8 = 0x125;
      }
    }
    else if (uVar12 >> 0x3c == 0) {
      pBVar6 = (BODY_AMQP_DATA *)calloc(1,uVar12 << 4);
      message->body_amqp_data_items = pBVar6;
      if (pBVar6 != (BODY_AMQP_DATA *)0x0) {
        pBVar1 = source_message->body_amqp_data_items;
        lVar9 = 8;
        uVar11 = 0;
        do {
          __size = *(size_t *)((long)&pBVar1->body_data_section_bytes + lVar9);
          *(size_t *)((long)&pBVar6->body_data_section_bytes + lVar9) = __size;
          __dest = malloc(__size);
          *(void **)((long)pBVar6 + lVar9 + -8) = __dest;
          if (__dest == (void *)0x0) {
            p_Var5 = xlogging_get_log_function();
            uVar12 = uVar11;
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                        ,"message_clone",0x10b,1,"Cannot allocate memory for body data section %u",
                        (int)uVar11);
            }
            break;
          }
          memcpy(__dest,*(void **)((long)pBVar1 + lVar9 + -8),__size);
          uVar11 = uVar11 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar12 != uVar11);
        message->body_amqp_data_count = uVar12;
        if (uVar12 < source_message->body_amqp_data_count) goto LAB_001270fe;
        goto LAB_00126fb2;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
      pcVar10 = "Cannot allocate memory for body data sections";
      iVar8 = 0xfb;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
      pcVar10 = "Invalid size for body_amqp_data_items";
      iVar8 = 0xf0;
    }
  }
  else {
    pHVar2 = header_clone(source_message->header);
    message->header = pHVar2;
    if (pHVar2 != (HEADER_HANDLE)0x0) goto LAB_00126c45;
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_001270fe;
    pcVar10 = "Cannot clone message header";
    iVar8 = 0xa3;
  }
LAB_001270f3:
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c",
            "message_clone",iVar8,1,pcVar10);
LAB_001270fe:
  message_destroy(message);
  return (MESSAGE_HANDLE)0x0;
}

Assistant:

MESSAGE_HANDLE message_clone(MESSAGE_HANDLE source_message)
{
    MESSAGE_HANDLE result;

    if (source_message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_062: [If `source_message` is NULL, `message_clone` shall fail and return NULL.] */
        LogError("NULL source_message");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MESSAGE_01_003: [`message_clone` shall clone a message entirely and on success return a non-NULL handle to the cloned message.] */
        result = (MESSAGE_HANDLE)message_create();
        if (result == NULL)
        {
            /* Codes_SRS_MESSAGE_01_004: [If allocating memory for the new cloned message fails, `message_clone` shall fail and return NULL.] */
            LogError("Cannot clone message");
        }
        else
        {
            result->message_format = source_message->message_format;

            if (source_message->header != NULL)
            {
                /* Codes_SRS_MESSAGE_01_005: [If a header exists on the source message it shall be cloned by using `header_clone`.] */
                result->header = header_clone(source_message->header);
                if (result->header == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message header");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->delivery_annotations != NULL))
            {
                /* Codes_SRS_MESSAGE_01_006: [If delivery annotations exist on the source message they shall be cloned by using `annotations_clone`.] */
                result->delivery_annotations = annotations_clone(source_message->delivery_annotations);
                if (result->delivery_annotations == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone delivery annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->message_annotations != NULL))
            {
                /* Codes_SRS_MESSAGE_01_007: [If message annotations exist on the source message they shall be cloned by using `annotations_clone`.] */
                result->message_annotations = annotations_clone(source_message->message_annotations);
                if (result->message_annotations == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->properties != NULL))
            {
                /* Codes_SRS_MESSAGE_01_008: [If message properties exist on the source message they shall be cloned by using `properties_clone`.] */
                result->properties = properties_clone(source_message->properties);
                if (result->properties == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message properties");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->application_properties != NULL))
            {
                /* Codes_SRS_MESSAGE_01_009: [If application properties exist on the source message they shall be cloned by using `amqpvalue_clone`.] */
                result->application_properties = amqpvalue_clone(source_message->application_properties);
                if (result->application_properties == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone application annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->footer != NULL))
            {
                /* Codes_SRS_MESSAGE_01_010: [If a footer exists on the source message it shall be cloned by using `annotations_clone`.] */
                result->footer = amqpvalue_clone(source_message->footer);
                if (result->footer == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message footer");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->body_amqp_data_count > 0))
            {
                size_t calloc_size = safe_multiply_size_t(source_message->body_amqp_data_count, sizeof(BODY_AMQP_DATA));

                if (calloc_size == SIZE_MAX)
                {
                    LogError("Invalid size for body_amqp_data_items");
                    message_destroy(result);
                    result = NULL;
                }
                else
                {
                    result->body_amqp_data_items = (BODY_AMQP_DATA*)calloc(1, calloc_size);

                    if (result->body_amqp_data_items == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                        LogError("Cannot allocate memory for body data sections");
                        message_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t i;

                        for (i = 0; i < source_message->body_amqp_data_count; i++)
                        {
                            result->body_amqp_data_items[i].body_data_section_length = source_message->body_amqp_data_items[i].body_data_section_length;

                            /* Codes_SRS_MESSAGE_01_011: [If an AMQP data has been set as message body on the source message it shall be cloned by allocating memory for the binary payload.] */
                            result->body_amqp_data_items[i].body_data_section_bytes = (unsigned char*)malloc(source_message->body_amqp_data_items[i].body_data_section_length);
                            if (result->body_amqp_data_items[i].body_data_section_bytes == NULL)
                            {
                                LogError("Cannot allocate memory for body data section %u", (unsigned int)i);
                                break;
                            }
                            else
                            {
                                (void)memcpy(result->body_amqp_data_items[i].body_data_section_bytes, source_message->body_amqp_data_items[i].body_data_section_bytes, result->body_amqp_data_items[i].body_data_section_length);
                            }
                        }

                        result->body_amqp_data_count = i;
                        if (i < source_message->body_amqp_data_count)
                        {
                            /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                            message_destroy(result);
                            result = NULL;
                        }
                    }
                }
            }

            if ((result != NULL) && (source_message->body_amqp_sequence_count > 0))
            {
                size_t calloc_size = safe_multiply_size_t(source_message->body_amqp_sequence_count, sizeof(AMQP_VALUE));

                if (calloc_size == SIZE_MAX)
                {
                    LogError("Invalid size for body_amqp_sequence_items");
                    message_destroy(result);
                    result = NULL;
                }
                else
                {
                    result->body_amqp_sequence_items = (AMQP_VALUE*)calloc(1, calloc_size);
                    if (result->body_amqp_sequence_items == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                        LogError("Cannot allocate memory for body AMQP sequences");
                        message_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t i;

                        for (i = 0; i < source_message->body_amqp_sequence_count; i++)
                        {
                            /* Codes_SRS_MESSAGE_01_160: [ If AMQP sequences are set as AMQP body they shall be cloned by calling `amqpvalue_clone`. ] */
                            result->body_amqp_sequence_items[i] = amqpvalue_clone(source_message->body_amqp_sequence_items[i]);
                            if (result->body_amqp_sequence_items[i] == NULL)
                            {
                                LogError("Cannot clone AMQP sequence %u", (unsigned int)i);
                                break;
                            }
                        }

                        result->body_amqp_sequence_count = i;
                        if (i < source_message->body_amqp_sequence_count)
                        {
                            /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                            message_destroy(result);
                            result = NULL;
                        }
                    }
				}
            }

            if ((result != NULL) && (source_message->body_amqp_value != NULL))
            {
                /* Codes_SRS_MESSAGE_01_159: [If an AMQP value has been set as message body on the source message it shall be cloned by calling `amqpvalue_clone`. ]*/
                result->body_amqp_value = amqpvalue_clone(source_message->body_amqp_value);
                if (result->body_amqp_value == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone body AMQP value");
                    message_destroy(result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}